

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator __thiscall
QHash<QString,QVariant>::emplace<QVariant_const&>
          (QHash<QString,_QVariant> *this,QString *key,QVariant *args)

{
  long lVar1;
  bool bVar2;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  iterator iVar3;
  QHash<QString,_QVariant> copy;
  QVariant *in_stack_ffffffffffffff48;
  QVariant *in_stack_ffffffffffffff50;
  QVariant *in_stack_ffffffffffffff58;
  QString *in_stack_ffffffffffffff60;
  QHash<QString,_QVariant> *in_stack_ffffffffffffff68;
  undefined1 local_40 [16];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QHash<QString,_QVariant>::isDetached
                    ((QHash<QString,_QVariant> *)in_stack_ffffffffffffff50);
  if (bVar2) {
    bVar2 = QHashPrivate::Data<QHashPrivate::Node<QString,_QVariant>_>::shouldGrow
                      ((Data<QHashPrivate::Node<QString,_QVariant>_> *)*in_RDI);
    if (bVar2) {
      ::QVariant::QVariant(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      local_40 = (undefined1  [16])
                 QHash<QString,_QVariant>::emplace_helper<QVariant>
                           (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                            in_stack_ffffffffffffff58);
      ::QVariant::~QVariant(in_stack_ffffffffffffff50);
    }
    else {
      local_40 = (undefined1  [16])
                 emplace_helper<QVariant_const&>
                           (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                            in_stack_ffffffffffffff58);
    }
  }
  else {
    QHash<QString,_QVariant>::QHash
              ((QHash<QString,_QVariant> *)in_stack_ffffffffffffff50,
               (QHash<QString,_QVariant> *)in_stack_ffffffffffffff48);
    QHash<QString,_QVariant>::detach((QHash<QString,_QVariant> *)in_stack_ffffffffffffff50);
    local_40 = (undefined1  [16])
               emplace_helper<QVariant_const&>
                         (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                          in_stack_ffffffffffffff58);
    QHash<QString,_QVariant>::~QHash((QHash<QString,_QVariant> *)in_stack_ffffffffffffff50);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    iVar3.i.d = (Data<QHashPrivate::Node<QString,_QVariant>_> *)local_40._0_8_;
    iVar3.i.bucket = local_40._8_8_;
    return (iterator)iVar3.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }